

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkparser.cpp
# Opt level: O1

void __thiscall
LinkParser::parseReaction
          (LinkParser *this,Link *link,int type,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  InputError *this_00;
  string local_50;
  double local_30;
  double x;
  
  iVar4 = (*(link->super_Element)._vptr_Element[2])(link);
  if (iVar4 == 0) {
    pbVar1 = (tokenList->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar3 = Utilities::parseNumber<double>(pbVar1 + 2,&local_30);
    if (!bVar3) {
      this_00 = (InputError *)__cxa_allocate_exception(0x30);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar2 = pbVar1[1]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar2,pcVar2 + pbVar1[1]._M_string_length);
      InputError::InputError(this_00,6,&local_50);
      __cxa_throw(this_00,&InputError::typeinfo,ENerror::~ENerror);
    }
    if (type == 0) {
      lVar5 = 0xd0;
    }
    else {
      if (type != 1) {
        return;
      }
      lVar5 = 0xd8;
    }
    *(double *)((long)&(link->super_Element)._vptr_Element + lVar5) = local_30;
  }
  return;
}

Assistant:

void LinkParser::parseReaction(Link* link, int type, vector<string>& tokenList)
{
    // Contents of tokenList are:
    // 0 - BULK/WALL keyword
    // 1 - link ID
    // 2 - reaction coeff. (1/days)

    // ... cast link to a pipe (only pipe links have reactions)

    if ( link->type() != Link::PIPE ) return;
    Pipe* pipe = static_cast<Pipe*>(link);

    // ... read reaction coeff.

    double x;
    string* tokens = &tokenList[0];
    if ( !Utilities::parseNumber(tokens[2], x) )
    {
        throw InputError(InputError::INVALID_NUMBER, tokens[1]);
    }

    // ... save reaction coeff.

    if      (type == Link::BULK) pipe->bulkCoeff = x;
    else if (type == Link::WALL) pipe->wallCoeff = x;
}